

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_check_lds(lua_State *L,char *buf)

{
  char *pcVar1;
  int iVar2;
  GCstr *pGVar3;
  char *str;
  bool bVar4;
  char *local_30;
  char *e;
  char *p;
  char *buf_local;
  lua_State *L_local;
  
  iVar2 = strncmp(buf,"GROUP",5);
  if (((iVar2 == 0) || (iVar2 = strncmp(buf,"INPUT",5), iVar2 == 0)) &&
     (e = strchr(buf,0x28), e != (char *)0x0)) {
    do {
      str = e + 1;
      pcVar1 = e + 1;
      local_30 = str;
      e = str;
    } while (*pcVar1 == ' ');
    while( true ) {
      bVar4 = false;
      if ((*local_30 != '\0') && (bVar4 = false, *local_30 != ' ')) {
        bVar4 = *local_30 != ')';
      }
      if (!bVar4) break;
      local_30 = local_30 + 1;
    }
    pGVar3 = lj_str_new(L,str,(long)local_30 - (long)str);
    L_local = (lua_State *)(pGVar3 + 1);
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return (char *)L_local;
}

Assistant:

static const char *clib_check_lds(lua_State *L, const char *buf)
{
  char *p, *e;
  if ((!strncmp(buf, "GROUP", 5) || !strncmp(buf, "INPUT", 5)) &&
      (p = strchr(buf, '('))) {
    while (*++p == ' ') ;
    for (e = p; *e && *e != ' ' && *e != ')'; e++) ;
    return strdata(lj_str_new(L, p, e-p));
  }
  return NULL;
}